

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

Error * ot::commissioner::utils::Hex(Error *__return_storage_ptr__,ByteArray *aBuf,string *aHexStr)

{
  pointer *ppuVar1;
  char cVar2;
  pointer pcVar3;
  iterator __position;
  char cVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  writer write;
  writer local_90;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_50;
  
  if ((aHexStr->_M_string_length & 1) == 0) {
    if (aHexStr->_M_string_length != 0) {
      uVar9 = 0;
      do {
        pcVar3 = (aHexStr->_M_dataplus)._M_p;
        bVar5 = pcVar3[uVar9];
        iVar6 = isxdigit((int)(char)bVar5);
        if (iVar6 == 0) {
LAB_00143553:
          local_88.types_[0] = string_type;
          pcVar7 = "{} is not a valid HEX string; there is non-HEX char";
          local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "{} is not a valid HEX string; there is non-HEX char";
          local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
          local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_88.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_90.handler_ = &local_88;
          local_88.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_88.context_.types_ = (local_90.handler_)->types_;
          do {
            cVar2 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar2 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&local_90,pcVar7,"");
                goto LAB_001435fa;
              }
              cVar2 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&local_90,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar8,"",&local_88);
          } while (pcVar7 != "");
LAB_001435fa:
          local_88._0_8_ = (aHexStr->_M_dataplus)._M_p;
          local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               (char *)aHexStr->_M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x33;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&local_88;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_50,(v10 *)"{} is not a valid HEX string; there is non-HEX char",fmt_00,
                     args_00);
          __return_storage_ptr__->mCode = kInvalidArgs;
          (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->mMessage).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->mMessage,local_50._M_dataplus._M_p,
                     local_50._M_dataplus._M_p + local_50._M_string_length);
          goto LAB_00143646;
        }
        cVar2 = pcVar3[uVar9 + 1];
        iVar6 = isxdigit((int)cVar2);
        if (iVar6 == 0) goto LAB_00143553;
        iVar6 = isxdigit((int)(char)bVar5);
        if ((iVar6 == 0) || (iVar6 = isxdigit((int)cVar2), iVar6 == 0)) {
          abort();
        }
        cVar4 = -0x30;
        if ((byte)(cVar2 + 0x9fU) < 6) {
          cVar4 = -0x57;
        }
        if ((byte)(cVar2 + 0xbfU) < 6) {
          cVar4 = -0x37;
        }
        bVar5 = cVar4 + cVar2 | (((byte)((bVar5 & 0xdf) + 0xbf) < 6) * '\t' + bVar5) * '\x10';
        local_88.types_[0]._0_1_ = bVar5;
        __position._M_current =
             (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(aBuf,__position,(uchar *)&local_88);
        }
        else {
          *__position._M_current = bVar5;
          ppuVar1 = &(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar9 = uVar9 + 2;
      } while (uVar9 < aHexStr->_M_string_length);
    }
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_88.types_[0] = string_type;
    pcVar7 = "{} is not a valid HEX string; must have even length";
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "{} is not a valid HEX string; must have even length";
    local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
    local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_88.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_88.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_90.handler_ = &local_88;
    local_88.context_.types_ = local_88.types_;
    do {
      cVar2 = *pcVar7;
      pcVar8 = pcVar7;
      while (cVar2 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&local_90,pcVar7,"");
          goto LAB_00143502;
        }
        cVar2 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&local_90,pcVar7,pcVar8);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar8,"",&local_88);
    } while (pcVar7 != "");
LAB_00143502:
    local_88._0_8_ = (aHexStr->_M_dataplus)._M_p;
    local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)aHexStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x33;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"{} is not a valid HEX string; must have even length",fmt,args);
    __return_storage_ptr__->mCode = kInvalidArgs;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
LAB_00143646:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Hex(ByteArray &aBuf, const std::string &aHexStr)
{
    if (aHexStr.size() % 2 != 0)
    {
        return ERROR_INVALID_ARGS("{} is not a valid HEX string; must have even length", aHexStr);
    }

    for (size_t i = 0; i < aHexStr.size(); i += 2)
    {
        if (!isxdigit(aHexStr[i]) || !isxdigit(aHexStr[i + 1]))
        {
            return ERROR_INVALID_ARGS("{} is not a valid HEX string; there is non-HEX char", aHexStr);
        }
        aBuf.push_back((Hex(aHexStr[i]) << 4) | Hex(aHexStr[i + 1]));
    }
    return ERROR_NONE;
}